

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_str_insert_at_rune(nk_str *str,int pos,char *cstr,int len)

{
  nk_str *s;
  int in_ECX;
  long in_RDX;
  undefined4 in_ESI;
  nk_str *in_RDI;
  char *buffer;
  char *begin;
  nk_rune unicode;
  int glyph_len;
  int in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  int pos_00;
  undefined4 in_stack_ffffffffffffffe8;
  int local_4;
  
  if (((in_RDI == (nk_str *)0x0) || (in_RDX == 0)) || (in_ECX == 0)) {
    local_4 = 0;
  }
  else {
    s = (nk_str *)
        nk_str_at_rune((nk_str *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                       (int)((ulong)in_RDX >> 0x20),
                       (nk_rune *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                       (int *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    pos_00 = (int)((ulong)in_RDX >> 0x20);
    if (in_RDI->len == 0) {
      local_4 = nk_str_append_text_char(s,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    }
    else {
      nk_str_get_const(in_RDI);
      if (s == (nk_str *)0x0) {
        local_4 = 0;
      }
      else {
        local_4 = nk_str_insert_at_char
                            ((nk_str *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),pos_00,
                             (char *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                             in_stack_ffffffffffffffd4);
      }
    }
  }
  return local_4;
}

Assistant:

NK_API int
nk_str_insert_at_rune(struct nk_str *str, int pos, const char *cstr, int len)
{
int glyph_len;
nk_rune unicode;
const char *begin;
const char *buffer;

NK_ASSERT(str);
NK_ASSERT(cstr);
NK_ASSERT(len);
if (!str || !cstr || !len) return 0;
begin = nk_str_at_rune(str, pos, &unicode, &glyph_len);
if (!str->len)
return nk_str_append_text_char(str, cstr, len);
buffer = nk_str_get_const(str);
if (!begin) return 0;
return nk_str_insert_at_char(str, (int)(begin - buffer), cstr, len);
}